

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

Vec_Int_t * Pdr_ManLitsToCube(Pdr_Man_t *p,int k,int *pArray,int nArray)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  lit Entry;
  int local_28;
  int RegId;
  int i;
  int nArray_local;
  int *pArray_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  Vec_IntClear(p->vLits);
  local_28 = 0;
  do {
    if (nArray <= local_28) {
      iVar1 = Vec_IntSize(p->vLits);
      if ((-1 < iVar1) && (iVar1 = Vec_IntSize(p->vLits), iVar1 <= nArray)) {
        return p->vLits;
      }
      __assert_fail("Vec_IntSize(p->vLits) >= 0 && Vec_IntSize(p->vLits) <= nArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                    ,0x7f,"Vec_Int_t *Pdr_ManLitsToCube(Pdr_Man_t *, int, int *, int)");
    }
    iVar1 = lit_var(pArray[local_28]);
    iVar1 = Pdr_ObjRegNum(p,k,iVar1);
    if (iVar1 != -1) {
      if ((iVar1 < 0) || (iVar2 = Aig_ManRegNum(p->pAig), iVar2 <= iVar1)) {
        __assert_fail("RegId >= 0 && RegId < Aig_ManRegNum(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                      ,0x7c,"Vec_Int_t *Pdr_ManLitsToCube(Pdr_Man_t *, int, int *, int)");
      }
      p_00 = p->vLits;
      iVar2 = lit_sign(pArray[local_28]);
      Entry = toLitCond(iVar1,(uint)((iVar2 != 0 ^ 0xffU) & 1));
      Vec_IntPush(p_00,Entry);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Pdr_ManLitsToCube( Pdr_Man_t * p, int k, int * pArray, int nArray )
{
    int i, RegId;
    Vec_IntClear( p->vLits );
    for ( i = 0; i < nArray; i++ )
    {
        RegId = Pdr_ObjRegNum( p, k, lit_var(pArray[i]) );
        if ( RegId == -1 )
            continue;
        assert( RegId >= 0 && RegId < Aig_ManRegNum(p->pAig) );
        Vec_IntPush( p->vLits, toLitCond(RegId, !lit_sign(pArray[i])) );
    }
    assert( Vec_IntSize(p->vLits) >= 0 && Vec_IntSize(p->vLits) <= nArray );
    return p->vLits;
}